

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.hpp
# Opt level: O1

IMemoryAllocator * __thiscall
Diligent::SRBMemoryAllocator::GetShaderVariableDataAllocator(SRBMemoryAllocator *this,Uint32 Ind)

{
  FixedBlockMemoryAllocator *pFVar1;
  char (*in_RCX) [72];
  string msg;
  string local_38;
  
  if ((this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) &&
     (this->m_ShaderVariableDataAllocatorCount <= Ind)) {
    FormatString<char[26],char[72]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_DataAllocators == nullptr || Ind < m_ShaderVariableDataAllocatorCount",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetShaderVariableDataAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/SRBMemoryAllocator.hpp"
               ,0x36);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_DataAllocators == (FixedBlockMemoryAllocator *)0x0) {
    pFVar1 = (FixedBlockMemoryAllocator *)this->m_RawMemAllocator;
  }
  else {
    pFVar1 = this->m_DataAllocators + Ind;
  }
  return &pFVar1->super_IMemoryAllocator;
}

Assistant:

IMemoryAllocator& GetShaderVariableDataAllocator(Uint32 Ind)
    {
        VERIFY_EXPR(m_DataAllocators == nullptr || Ind < m_ShaderVariableDataAllocatorCount);
        return m_DataAllocators != nullptr ? m_DataAllocators[Ind] : m_RawMemAllocator;
    }